

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

extent_t *
extent_alloc_wrapper
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,void *new_addr,size_t size,
          size_t pad,size_t alignment,_Bool slab,szind_t szind,_Bool *zero,_Bool *commit)

{
  byte *pbVar1;
  long lVar2;
  extent_hooks_t **ppeVar3;
  arena_t *paVar4;
  extents_t *extents;
  _Bool _Var5;
  extent_split_interior_result_t eVar6;
  extent_t *peVar7;
  ulong uVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sn;
  uint uVar11;
  ulong uVar12;
  _Bool gdump_add;
  uint uVar13;
  int iVar14;
  rtree_ctx_t *prVar15;
  undefined1 uVar16;
  undefined1 slab_00;
  extent_t **lead_00;
  int iVar17;
  byte bVar18;
  undefined1 growing_retained;
  szind_t in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc60;
  _Bool committed;
  _Bool zeroed;
  extent_hooks_t **local_398;
  arena_t *local_390;
  extents_t *local_388;
  extent_t *local_380;
  size_t local_378;
  extent_t *extent;
  void *local_368;
  ulong local_360;
  extent_t *local_358;
  extent_t *to_salvage;
  extent_t *to_leak;
  extent_t *trail;
  extent_t *lead;
  rtree_ctx_t local_330;
  rtree_ctx_t rtree_ctx_fallback;
  
  local_380 = (extent_t *)size;
  extent_hooks_assure_initialized(arena,r_extent_hooks);
  malloc_mutex_lock(tsdn,&arena->extent_grow_mtx);
  local_388 = &arena->extents_retained;
  uVar8 = (ulong)slab;
  local_378 = pad;
  local_368 = new_addr;
  peVar7 = extent_recycle(tsdn,arena,r_extent_hooks,local_388,new_addr,(size_t)local_380,pad,
                          alignment,slab,szind,zero,commit,SUB41(in_stack_fffffffffffffc58,0));
  pvVar10 = local_368;
  if (peVar7 == (extent_t *)0x0) {
    slab_00 = (undefined1)szind;
    local_398 = r_extent_hooks;
    local_390 = arena;
    local_360 = uVar8;
    if ((local_368 == (void *)0x0) && (opt_retain != false)) {
      uVar12 = (long)&local_380->e_bits + local_378;
      uVar8 = (uVar12 - 0x1000) + (alignment + 0xfff & 0xfffffffffffff000);
      if (uVar12 <= uVar8) {
        uVar13 = arena->extent_grow_next;
        iVar14 = 1;
        do {
          uVar12 = sz_pind2sz_tab[uVar13];
          if (uVar8 <= uVar12) {
            extent = extent_alloc(tsdn,arena);
            paVar4 = local_390;
            ppeVar3 = local_398;
            if (extent == (extent_t *)0x0) break;
            zeroed = false;
            committed = false;
            local_358 = extent;
            if (*local_398 == &extent_hooks_default) {
              pvVar10 = extent_alloc_default_impl
                                  (tsdn,local_390,(void *)0x0,uVar12,0x1000,&zeroed,&committed);
            }
            else {
              extent_hook_pre_reentrancy(tsdn,local_390);
              pvVar10 = (*(*ppeVar3)->alloc)
                                  (*ppeVar3,(void *)0x0,uVar12,0x1000,&zeroed,&committed,
                                   paVar4->base->ind);
              extent_hook_post_reentrancy(tsdn);
            }
            sVar9 = arena_extent_sn_next(paVar4);
            peVar7 = local_358;
            uVar16 = 0xe8;
            extent_init(local_358,paVar4,pvVar10,uVar12,false,0xe8,sVar9,extent_state_active,zeroed,
                        committed,true);
            if (pvVar10 == (void *)0x0) {
              extent_dalloc(tsdn,paVar4,peVar7);
              break;
            }
            _Var5 = extent_register_impl(tsdn,peVar7,gdump_add);
            if (_Var5) {
              extents_leak(tsdn,paVar4,local_398,local_388,peVar7,(_Bool)uVar16);
              break;
            }
            uVar13 = (uint)peVar7->e_bits;
            if ((~uVar13 & 0xa000) == 0) {
              *zero = true;
            }
            if ((uVar13 >> 0xd & 1) != 0) {
              *commit = true;
            }
            if (tsdn == (tsdn_t *)0x0) {
              prVar15 = &rtree_ctx_fallback;
              rtree_ctx_data_init(prVar15);
            }
            else {
              prVar15 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
              ;
            }
            lead_00 = &lead;
            eVar6 = extent_split_interior
                              (tsdn,paVar4,local_398,prVar15,&extent,lead_00,&trail,&to_leak,
                               &to_salvage,local_380,local_378,alignment,local_360,(_Bool)slab_00,
                               in_stack_fffffffffffffc58,(_Bool)in_stack_fffffffffffffc60);
            growing_retained = (undefined1)in_stack_fffffffffffffc58;
            uVar16 = SUB81(lead_00,0);
            if (eVar6 != extent_split_interior_ok) {
              if (to_salvage != (extent_t *)0x0) {
                extent_record(tsdn,paVar4,local_398,local_388,to_salvage,(_Bool)uVar16);
              }
              if (to_leak != (extent_t *)0x0) {
                extent_deregister_no_gdump_sub(tsdn,to_leak);
                extents_leak(tsdn,local_390,local_398,local_388,to_leak,(_Bool)uVar16);
              }
              break;
            }
            if (lead != (extent_t *)0x0) {
              extent_record(tsdn,paVar4,local_398,local_388,lead,(_Bool)uVar16);
            }
            if (trail != (extent_t *)0x0) {
              extent_record(tsdn,paVar4,local_398,local_388,trail,(_Bool)uVar16);
            }
            peVar7 = extent;
            ppeVar3 = local_398;
            if ((*commit == true) && ((extent->e_bits & 0x2000) == 0)) {
              uVar8 = (extent->field_2).e_size_esn & 0xfffffffffffff000;
              _Var5 = extent_commit_impl(tsdn,paVar4,local_398,extent,0,uVar8,
                                         (_Bool)growing_retained);
              if (_Var5) {
                extent_record(tsdn,paVar4,ppeVar3,local_388,peVar7,SUB81(uVar8,0));
                break;
              }
              _Var5 = extent_need_manual_zero(paVar4);
              if (!_Var5) {
                pbVar1 = (byte *)((long)&peVar7->e_bits + 1);
                *pbVar1 = *pbVar1 | 0x80;
              }
            }
            uVar13 = iVar14 + paVar4->extent_grow_next;
            if (paVar4->retain_grow_limit <= uVar13) {
              uVar13 = paVar4->retain_grow_limit;
            }
            paVar4->extent_grow_next = uVar13;
            (paVar4->extent_grow_mtx).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock
                      ((pthread_mutex_t *)((long)&(paVar4->extent_grow_mtx).field_0 + 0x40));
            if (local_378 != 0) {
              extent_addr_randomize(tsdn,extent,alignment);
            }
            pvVar10 = local_368;
            peVar7 = extent;
            if (slab) {
              if (tsdn == (tsdn_t *)0x0) {
                prVar15 = &local_330;
                rtree_ctx_data_init(prVar15);
              }
              else {
                prVar15 = &(tsdn->tsd).
                           cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
              }
              peVar7 = extent;
              extent->e_bits = extent->e_bits | 0x1000;
              extent_interior_register(tsdn,prVar15,extent,szind);
            }
            if (*zero == true) {
              if ((peVar7->e_bits & 0x8000) != 0) {
                return peVar7;
              }
              pvVar10 = (void *)((ulong)peVar7->e_addr & 0xfffffffffffff000);
              uVar8 = (peVar7->field_2).e_size_esn & 0xfffffffffffff000;
              _Var5 = extent_need_manual_zero(paVar4);
              if ((!_Var5) && (_Var5 = pages_purge_forced(pvVar10,uVar8), !_Var5)) {
                return peVar7;
              }
              memset(pvVar10,0,uVar8);
              return peVar7;
            }
            if (peVar7 != (extent_t *)0x0) {
              return peVar7;
            }
            goto LAB_001234fe;
          }
          for (lVar2 = 0x3f; 0xdfffffffffffffffU >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
          uVar11 = (uint)lVar2;
          iVar17 = uVar11 - 0xe;
          if (uVar11 < 0xe) {
            iVar17 = 0;
          }
          bVar18 = (char)lVar2 - 3;
          if (uVar11 < 0xf) {
            bVar18 = 0xc;
          }
          uVar13 = uVar13 + 1;
          iVar14 = iVar14 + 1;
        } while (uVar13 < ((uint)(((0x6fffffffffffffffU >> (bVar18 & 0x3f)) << (bVar18 & 0x3f)) >>
                                 (bVar18 & 0x3f)) & 3) + iVar17 * 4);
      }
      (local_390->extent_grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(local_390->extent_grow_mtx).field_0 + 0x40));
      pvVar10 = local_368;
    }
    else {
      (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->extent_grow_mtx).field_0 + 0x40));
    }
LAB_001234fe:
    paVar4 = local_390;
    if (((pvVar10 == (void *)0x0) || (opt_retain == false)) &&
       (peVar7 = extent_alloc(tsdn,local_390), ppeVar3 = local_398, peVar7 != (extent_t *)0x0)) {
      sVar9 = (long)&local_380->e_bits + local_378;
      uVar8 = alignment + 0xfff & 0xfffffffffffff000;
      if (*local_398 == &extent_hooks_default) {
        pvVar10 = extent_alloc_default_impl(tsdn,paVar4,pvVar10,sVar9,uVar8,zero,commit);
      }
      else {
        local_380 = peVar7;
        extent_hook_pre_reentrancy(tsdn,paVar4);
        pvVar10 = (*(*ppeVar3)->alloc)(*ppeVar3,pvVar10,sVar9,uVar8,zero,commit,paVar4->base->ind);
        peVar7 = local_380;
        extent_hook_post_reentrancy(tsdn);
      }
      extents = local_388;
      if (pvVar10 == (void *)0x0) {
        extent_dalloc(tsdn,paVar4,peVar7);
      }
      else {
        sn = arena_extent_sn_next(paVar4);
        extent_init(peVar7,paVar4,pvVar10,sVar9,SUB81(local_360,0),szind,sn,extent_state_active,
                    *zero,*commit,true);
        if (local_378 != 0) {
          extent_addr_randomize(tsdn,peVar7,alignment);
        }
        _Var5 = extent_register(tsdn,peVar7);
        if (!_Var5) {
          return peVar7;
        }
        extents_leak(tsdn,paVar4,local_398,extents,peVar7,(_Bool)slab_00);
      }
    }
    peVar7 = (extent_t *)0x0;
  }
  else {
    (arena->extent_grow_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->extent_grow_mtx).field_0 + 0x40));
  }
  return peVar7;
}

Assistant:

extent_t *
extent_alloc_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);

	extent_t *extent = extent_alloc_retained(tsdn, arena, r_extent_hooks,
	    new_addr, size, pad, alignment, slab, szind, zero, commit);
	if (extent == NULL) {
		if (opt_retain && new_addr != NULL) {
			/*
			 * When retain is enabled and new_addr is set, we do not
			 * attempt extent_alloc_wrapper_hard which does mmap
			 * that is very unlikely to succeed (unless it happens
			 * to be at the end).
			 */
			return NULL;
		}
		extent = extent_alloc_wrapper_hard(tsdn, arena, r_extent_hooks,
		    new_addr, size, pad, alignment, slab, szind, zero, commit);
	}

	assert(extent == NULL || extent_dumpable_get(extent));
	return extent;
}